

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::Postprocess_BuildShape
          (X3DImporter *this,CX3DImporter_NodeElement_Shape *pShapeNodeElement,
          list<unsigned_int,_std::allocator<unsigned_int>_> *pNodeMeshInd,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList,
          list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList)

{
  EType pType;
  CX3DImporter_NodeElement *pNodeElement;
  int iVar1;
  bool bVar2;
  uint uVar3;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar4;
  X3DImporter *this_00;
  X3DImporter *this_01;
  _List_node_base *p_Var5;
  int32_t tm;
  aiMaterial *tmat;
  _Rb_tree_color local_5c;
  aiMesh *tmesh;
  ulong local_50;
  X3DImporter *local_48;
  list<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  X3DImporter *local_38;
  
  tmat = (aiMaterial *)0x0;
  tmesh = (aiMesh *)0x0;
  plVar4 = &(pShapeNodeElement->super_CX3DImporter_NodeElement).Child;
  local_5c = _S_red;
  local_50 = 0x2c;
  this_00 = this;
  p_Var5 = (_List_node_base *)plVar4;
  local_48 = (X3DImporter *)pSceneMaterialList;
  local_40 = pNodeMeshInd;
  local_38 = (X3DImporter *)pSceneMeshList;
  while (p_Var5 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)plVar4) {
    pNodeElement = (CX3DImporter_NodeElement *)p_Var5[1]._M_next;
    pType = pNodeElement->Type;
    bVar2 = PostprocessHelper_ElementIsMesh(this_00,pType);
    if (bVar2) {
      this_00 = this;
      Postprocess_BuildMesh(this,pNodeElement,&tmesh);
      this_01 = local_38;
      if (tmesh != (aiMesh *)0x0) {
        tm = (local_38->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_color;
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (local_40,(value_type_conflict3 *)&tm);
        std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_01,&tmesh);
        local_50 = (ulong)*(uint *)((long)p_Var5[1]._M_next + 8);
        this_00 = this_01;
      }
    }
    else if (pType == ENET_Appearance) {
      Postprocess_BuildMaterial(this_00,pNodeElement,&tmat);
      if (tmat != (aiMaterial *)0x0) {
        local_5c = (local_48->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header.
                   _M_header._M_color;
        this_00 = local_48;
        std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                  ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_48,&tmat);
      }
    }
  }
  if (tmesh != (aiMesh *)0x0 && tmat != (aiMaterial *)0x0) {
    tmesh->mMaterialIndex = local_5c;
    uVar3 = aiGetMaterialTextureCount(tmat,aiTextureType_DIFFUSE);
    if ((uVar3 != 0) &&
       ((tmesh->mTextureCoords[0] == (aiVector3D *)0x0 || (tmesh->mNumVertices == 0)))) {
      iVar1 = (int)local_50;
      if (iVar1 - 0x10U < 2) {
        tm = 2;
      }
      else if (iVar1 == 0x12) {
        tm = 1;
      }
      else if (iVar1 == 0xf) {
        tm = 3;
      }
      else {
        tm = 4;
      }
      aiMaterial::AddProperty(tmat,&tm,1,"$tex.mapping",1,0);
    }
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildShape(const CX3DImporter_NodeElement_Shape& pShapeNodeElement, std::list<unsigned int>& pNodeMeshInd,
							std::list<aiMesh*>& pSceneMeshList, std::list<aiMaterial*>& pSceneMaterialList) const
{
    aiMaterial* tmat = nullptr;
    aiMesh* tmesh = nullptr;
    CX3DImporter_NodeElement::EType mesh_type = CX3DImporter_NodeElement::ENET_Invalid;
    unsigned int mat_ind = 0;

	for(std::list<CX3DImporter_NodeElement*>::const_iterator it = pShapeNodeElement.Child.begin(); it != pShapeNodeElement.Child.end(); ++it)
	{
		if(PostprocessHelper_ElementIsMesh((*it)->Type))
		{
			Postprocess_BuildMesh(**it, &tmesh);
			if(tmesh != nullptr)
			{
				// if mesh successfully built then add data about it to arrays
				pNodeMeshInd.push_back(static_cast<unsigned int>(pSceneMeshList.size()));
				pSceneMeshList.push_back(tmesh);
				// keep mesh type. Need above for texture coordinate generation.
				mesh_type = (*it)->Type;
			}
		}
		else if((*it)->Type == CX3DImporter_NodeElement::ENET_Appearance)
		{
			Postprocess_BuildMaterial(**it, &tmat);
			if(tmat != nullptr)
			{
				// if material successfully built then add data about it to array
				mat_ind = static_cast<unsigned int>(pSceneMaterialList.size());
				pSceneMaterialList.push_back(tmat);
			}
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = pShapeNodeElement.Child.begin(); it != pShapeNodeElement.Child.end(); it++)

	// associate read material with read mesh.
	if((tmesh != nullptr) && (tmat != nullptr))
	{
		tmesh->mMaterialIndex = mat_ind;
		// Check texture mapping. If material has texture but mesh has no texture coordinate then try to ask Assimp to generate texture coordinates.
		if((tmat->GetTextureCount(aiTextureType_DIFFUSE) != 0) && !tmesh->HasTextureCoords(0))
		{
			int32_t tm;
			aiVector3D tvec3;

			switch(mesh_type)
			{
				case CX3DImporter_NodeElement::ENET_Box:
					tm = aiTextureMapping_BOX;
					break;
				case CX3DImporter_NodeElement::ENET_Cone:
				case CX3DImporter_NodeElement::ENET_Cylinder:
					tm = aiTextureMapping_CYLINDER;
					break;
				case CX3DImporter_NodeElement::ENET_Sphere:
					tm = aiTextureMapping_SPHERE;
					break;
				default:
					tm = aiTextureMapping_PLANE;
					break;
			}// switch(mesh_type)

			tmat->AddProperty(&tm, 1, AI_MATKEY_MAPPING_DIFFUSE(0));
		}// if((tmat->GetTextureCount(aiTextureType_DIFFUSE) != 0) && !tmesh->HasTextureCoords(0))
	}// if((tmesh != nullptr) && (tmat != nullptr))
}